

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O1

double ON_InternalQuotient(double rel_tol,double numerator,double denominator)

{
  double dVar1;
  double __x;
  double dVar2;
  
  if ((!NAN(numerator)) && ((denominator != 0.0 || (NAN(denominator))))) {
    dVar1 = ON_InternalDefuzz(rel_tol,numerator / denominator);
    __x = 0.0;
    if ((numerator != 0.0) || (NAN(numerator))) {
      __x = ON_InternalDefuzz(rel_tol,denominator / numerator);
    }
    dVar2 = floor(__x);
    return (double)(~-(ulong)(2.0 <= __x) & (ulong)dVar1 |
                   (~-(ulong)(dVar2 == __x) & (ulong)dVar1 |
                   (ulong)(1.0 / __x) & -(ulong)(dVar2 == __x)) & -(ulong)(2.0 <= __x));
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
             ,0x55b,"","Invalid input.");
  return ON_DBL_QNAN;
}

Assistant:

static double ON_InternalQuotient(
  double rel_tol,
  double numerator,
  double denominator
)
{
  if (numerator == numerator && denominator != 0.0)
  {
    const double r = ON_InternalDefuzz(rel_tol, numerator / denominator);
    const double s = (numerator != 0.0) ? ON_InternalDefuzz(rel_tol, denominator / numerator ) : 0.0;
    return
      (s >= 2.0 && s == floor(s))
      ? (1.0 / s)
      : r;
  }
  ON_ERROR("Invalid input.");
  return ON_DBL_QNAN;
}